

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  FieldDescriptor *pFVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  FastFieldValuePrinter *pFVar5;
  Message *message_00;
  uint64 uVar6;
  int64 iVar7;
  string *this_00;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar8;
  long *plVar9;
  _func_void_FieldDescriptor_ptr *p_Var10;
  undefined4 uVar11;
  string scratch;
  string truncated_value;
  string local_b0;
  FieldDescriptor *local_90 [2];
  FieldDescriptor local_80 [16];
  _func_void_FieldDescriptor_ptr *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pFVar5 = GetFieldPrinter(this,field);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_b0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_50._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_b0,
               (FieldDescriptor **)local_50);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    if (*(int *)(field + 0x3c) == 3) {
      uVar4 = Reflection::GetRepeatedInt32(reflection,message,field,index);
    }
    else {
      uVar4 = Reflection::GetInt32(reflection,message,field);
    }
    (*pFVar5->_vptr_FastFieldValuePrinter[3])(pFVar5,(ulong)uVar4,generator);
    break;
  case 2:
    if (*(int *)(field + 0x3c) == 3) {
      iVar7 = Reflection::GetRepeatedInt64(reflection,message,field,index);
    }
    else {
      iVar7 = Reflection::GetInt64(reflection,message,field);
    }
    (*pFVar5->_vptr_FastFieldValuePrinter[5])(pFVar5,iVar7,generator);
    break;
  case 3:
    if (*(int *)(field + 0x3c) == 3) {
      uVar4 = Reflection::GetRepeatedUInt32(reflection,message,field,index);
    }
    else {
      uVar4 = Reflection::GetUInt32(reflection,message,field);
    }
    (*pFVar5->_vptr_FastFieldValuePrinter[4])(pFVar5,(ulong)uVar4,generator);
    break;
  case 4:
    if (*(int *)(field + 0x3c) == 3) {
      uVar6 = Reflection::GetRepeatedUInt64(reflection,message,field,index);
    }
    else {
      uVar6 = Reflection::GetUInt64(reflection,message,field);
    }
    (*pFVar5->_vptr_FastFieldValuePrinter[6])(pFVar5,uVar6,generator);
    break;
  case 5:
    if (*(int *)(field + 0x3c) == 3) {
      dVar2 = Reflection::GetRepeatedDouble(reflection,message,field,index);
      uVar11 = SUB84(dVar2,0);
    }
    else {
      dVar2 = Reflection::GetDouble(reflection,message,field);
      uVar11 = SUB84(dVar2,0);
    }
    (*pFVar5->_vptr_FastFieldValuePrinter[8])(uVar11,pFVar5,generator);
    break;
  case 6:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::GetRepeatedFloat(reflection,message,field,index);
    }
    else {
      Reflection::GetFloat(reflection,message,field);
    }
    (*pFVar5->_vptr_FastFieldValuePrinter[7])(pFVar5,generator);
    break;
  case 7:
    if (*(int *)(field + 0x3c) == 3) {
      bVar3 = Reflection::GetRepeatedBool(reflection,message,field,index);
    }
    else {
      bVar3 = Reflection::GetBool(reflection,message,field);
    }
    (*pFVar5->_vptr_FastFieldValuePrinter[2])(pFVar5,(ulong)bVar3,generator);
    break;
  case 8:
    if (*(int *)(field + 0x3c) == 3) {
      uVar4 = Reflection::GetRepeatedEnumValue(reflection,message,field,index);
    }
    else {
      uVar4 = Reflection::GetEnumValue(reflection,message,field);
    }
    this_01 = FieldDescriptor::enum_type(field);
    pEVar8 = EnumDescriptor::FindValueByNumber(this_01,uVar4);
    if (pEVar8 != (EnumValueDescriptor *)0x0) {
      (*pFVar5->_vptr_FastFieldValuePrinter[0xb])
                (pFVar5,(ulong)uVar4,*(undefined8 *)pEVar8,generator);
      return;
    }
    StringPrintf_abi_cxx11_(&local_b0,"%d",(ulong)uVar4);
    (*pFVar5->_vptr_FastFieldValuePrinter[0xb])(pFVar5,(ulong)uVar4,&local_b0,generator);
    goto LAB_002a9bbc;
  case 9:
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    if (*(int *)(field + 0x3c) == 3) {
      this_00 = Reflection::GetRepeatedStringReference(reflection,message,field,index,&local_b0);
    }
    else {
      this_00 = Reflection::GetStringReference(reflection,message,field,&local_b0);
    }
    pFVar1 = (FieldDescriptor *)(local_50 + 0x10);
    local_50._8_8_ = 0;
    local_40._M_local_buf[0] = '\0';
    local_50._0_8_ = pFVar1;
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < this_00->_M_string_length)) {
      std::__cxx11::string::substr((ulong)local_90,(ulong)this_00);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_90);
      p_Var10 = (_func_void_FieldDescriptor_ptr *)(plVar9 + 2);
      if ((_func_void_FieldDescriptor_ptr *)*plVar9 == p_Var10) {
        local_60 = *(long *)p_Var10;
        lStack_58 = plVar9[3];
        local_70 = (_func_void_FieldDescriptor_ptr *)&local_60;
      }
      else {
        local_60 = *(long *)p_Var10;
        local_70 = (_func_void_FieldDescriptor_ptr *)*plVar9;
      }
      local_68 = plVar9[1];
      *plVar9 = (long)p_Var10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      this_00 = (string *)local_50;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
      if (local_70 != (_func_void_FieldDescriptor_ptr *)&local_60) {
        operator_delete(local_70);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_70 = FieldDescriptor::TypeOnceInit;
      local_90[0] = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_70,local_90);
    }
    (*pFVar5->_vptr_FastFieldValuePrinter[(ulong)(*(int *)(field + 0x38) != 9) + 9])
              (pFVar5,this_00,generator);
    if ((FieldDescriptor *)local_50._0_8_ != pFVar1) {
      operator_delete((void *)local_50._0_8_);
    }
LAB_002a9bbc:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    break;
  case 10:
    if (*(int *)(field + 0x3c) == 3) {
      message_00 = Reflection::GetRepeatedMessage(reflection,message,field,index);
    }
    else {
      message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
    }
    Print(this,message_00,generator);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          TextGenerator* generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          truncate_string_field_longer_than_ < value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, enum_desc->name(), generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, StringPrintf("%d", enum_value),
                           generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}